

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O3

void __thiscall expr_ternary_Test::TestBody(expr_ternary_Test *this)

{
  element_type *peVar1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar2;
  Generator *pGVar3;
  Var *pVVar4;
  Var *pVVar5;
  Var *pVVar6;
  _func_int **message;
  char *pcVar7;
  undefined1 local_980 [8];
  Generator mod;
  Context c;
  ConditionalExpr result;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  undefined1 local_58 [32];
  undefined1 local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  mod._1376_8_ = &c.modules_._M_h._M_rehash_policy._M_next_resize;
  c.modules_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.modules_._M_h._M_bucket_count = 0;
  c.modules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.modules_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.modules_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.modules_._M_h._M_rehash_policy._4_4_ = 0;
  c.modules_._M_h._M_rehash_policy._M_next_resize = 0;
  c.modules_._M_h._M_single_bucket =
       (__node_base_ptr)&c.generator_hash_._M_h._M_rehash_policy._M_next_resize;
  c.generator_hash_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.generator_hash_._M_h._M_bucket_count = 0;
  c.generator_hash_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.generator_hash_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&c.enum_defs_;
  c.enum_defs_._M_t._M_impl._0_4_ = 0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.generator_hash_._M_h._M_rehash_policy._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_next_resize = 0;
  c.generator_hash_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&c.empty_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.empty_generators_._M_h._M_bucket_count = 0;
  c.empty_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.empty_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c._224_8_ = &c.tracked_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.empty_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.empty_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  c.empty_generators_._M_h._M_single_bucket._0_1_ = 0;
  c.tracked_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.tracked_generators_._M_h._M_bucket_count = 0;
  c.tracked_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.tracked_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.tracked_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.tracked_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.tracked_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  pvVar2 = &result.super_Expr.super_Var.super_IRNode.fn_name_ln;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)pvVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&c.tracked_generators_._M_h._M_single_bucket,"mod","");
  pGVar3 = kratos::Context::generator
                     ((Context *)&mod.use_stmts_remove_cache_,
                      (string *)&c.tracked_generators_._M_h._M_single_bucket);
  kratos::Generator::Generator((Generator *)local_980,pGVar3);
  if ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       *)c.tracked_generators_._M_h._M_single_bucket != pvVar2) {
    operator_delete(c.tracked_generators_._M_h._M_single_bucket,
                    (ulong)((long)&((result.super_Expr.super_Var.super_IRNode.fn_name_ln.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                   _M_p + 1));
  }
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)pvVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&c.tracked_generators_._M_h._M_single_bucket,"cond","");
  pVVar4 = kratos::Generator::var
                     ((Generator *)local_980,(string *)&c.tracked_generators_._M_h._M_single_bucket,
                      1);
  if ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       *)c.tracked_generators_._M_h._M_single_bucket != pvVar2) {
    operator_delete(c.tracked_generators_._M_h._M_single_bucket,
                    (ulong)((long)&((result.super_Expr.super_Var.super_IRNode.fn_name_ln.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                   _M_p + 1));
  }
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)pvVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&c.tracked_generators_._M_h._M_single_bucket,"a","");
  pVVar5 = kratos::Generator::var
                     ((Generator *)local_980,(string *)&c.tracked_generators_._M_h._M_single_bucket,
                      1);
  if ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       *)c.tracked_generators_._M_h._M_single_bucket != pvVar2) {
    operator_delete(c.tracked_generators_._M_h._M_single_bucket,
                    (ulong)((long)&((result.super_Expr.super_Var.super_IRNode.fn_name_ln.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                   _M_p + 1));
  }
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)pvVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&c.tracked_generators_._M_h._M_single_bucket,"b","");
  pVVar6 = kratos::Generator::var
                     ((Generator *)local_980,(string *)&c.tracked_generators_._M_h._M_single_bucket,
                      1);
  if ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       *)c.tracked_generators_._M_h._M_single_bucket != pvVar2) {
    operator_delete(c.tracked_generators_._M_h._M_single_bucket,
                    (ulong)((long)&((result.super_Expr.super_Var.super_IRNode.fn_name_ln.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                   _M_p + 1));
  }
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_58,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &pVVar4->super_enable_shared_from_this<kratos::Var>);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_38,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &pVVar5->super_enable_shared_from_this<kratos::Var>);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&result.condition,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &pVVar6->super_enable_shared_from_this<kratos::Var>);
  kratos::ConditionalExpr::ConditionalExpr
            ((ConditionalExpr *)&c.tracked_generators_._M_h._M_single_bucket,
             (shared_ptr<kratos::Var> *)local_58,(shared_ptr<kratos::Var> *)local_38,
             (shared_ptr<kratos::Var> *)&result.condition);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  kratos::ConditionalExpr::to_string_abi_cxx11_
            ((string *)local_58,(ConditionalExpr *)&c.tracked_generators_._M_h._M_single_bucket);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
            ((internal *)local_38,"result.to_string()","\"cond ? a: b\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [12])"cond ? a: b");
  peVar1 = (element_type *)(local_58 + 0x10);
  if ((element_type *)local_58._0_8_ != peVar1) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if (local_38[0] == (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)0x0) {
    testing::Message::Message((Message *)local_58);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int **)0x253c24;
    }
    else {
      message = (_func_int **)((_Alloc_hider *)&(local_30._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&result.condition,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xe6,(char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&result.condition,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result.condition);
    if ((element_type *)local_58._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_58._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._M_pi
                );
  }
  kratos::ConditionalExpr::handle_name_abi_cxx11_
            ((string *)local_58,(ConditionalExpr *)&c.tracked_generators_._M_h._M_single_bucket,true
            );
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
            ((internal *)local_38,"result.handle_name(true)","\"cond ? a: b\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [12])"cond ? a: b");
  if ((element_type *)local_58._0_8_ != peVar1) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if (local_38[0] == (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)0x0) {
    testing::Message::Message((Message *)local_58);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_30._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&result.condition,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xe7,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&result.condition,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result.condition);
    if ((element_type *)local_58._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_58._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._M_pi
                );
  }
  kratos::ConditionalExpr::handle_name_abi_cxx11_
            ((string *)local_58,(ConditionalExpr *)&c.tracked_generators_._M_h._M_single_bucket,
             false);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[24]>
            ((internal *)local_38,"result.handle_name(false)","\"mod.cond ? mod.a: mod.b\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [24])"mod.cond ? mod.a: mod.b");
  if ((element_type *)local_58._0_8_ != peVar1) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if (local_38[0] == (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)0x0) {
    testing::Message::Message((Message *)local_58);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_30._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&result.condition,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xe8,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&result.condition,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result.condition);
    if ((element_type *)local_58._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_58._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._M_pi
                );
  }
  kratos::ConditionalExpr::handle_name_abi_cxx11_
            ((string *)local_58,(ConditionalExpr *)&c.tracked_generators_._M_h._M_single_bucket,
             (Generator *)local_980);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
            ((internal *)local_38,"result.handle_name(&mod)","\"cond ? a: b\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [12])"cond ? a: b");
  if ((element_type *)local_58._0_8_ != peVar1) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if (local_38[0] == (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)0x0) {
    testing::Message::Message((Message *)local_58);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_30._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&result.condition,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xe9,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&result.condition,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result.condition);
    if ((element_type *)local_58._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_58._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._M_pi
                );
  }
  kratos::Var::~Var((Var *)&c.tracked_generators_._M_h._M_single_bucket);
  kratos::Generator::~Generator((Generator *)local_980);
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.track_generated_);
  std::
  _Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
               *)&c.max_instance_id_);
  std::
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&c.modules_._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&mod.use_stmts_remove_cache_);
  return;
}

Assistant:

TEST(expr, ternary) {  // NOLINT
    Context c;
    auto mod = c.generator("mod");
    auto &cond = mod.var("cond", 1);
    auto &a = mod.var("a", 1);
    auto &b = mod.var("b", 1);
    auto result =
        ConditionalExpr(cond.shared_from_this(), a.shared_from_this(), b.shared_from_this());
    EXPECT_EQ(result.to_string(), "cond ? a: b");
    EXPECT_EQ(result.handle_name(true), "cond ? a: b");
    EXPECT_EQ(result.handle_name(false), "mod.cond ? mod.a: mod.b");
    EXPECT_EQ(result.handle_name(&mod), "cond ? a: b");
}